

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void resume(lua_State *L,void *ud)

{
  StkId pSVar1;
  lua_KFunction p_Var2;
  int nres;
  CallInfo *ci;
  
  nres = *ud;
  pSVar1 = (L->top).p;
  if (L->status != '\0') {
    ci = L->ci;
    L->status = '\0';
    p_Var2 = (ci->u).c.k;
    if ((ci->callstatus & 2) == 0) {
      (ci->u).l.savedpc = (Instruction *)(p_Var2 + -4);
      (L->top).p = pSVar1 + -(long)nres;
      luaV_execute(L,ci);
    }
    else {
      if (p_Var2 != (lua_KFunction)0x0) {
        nres = (*p_Var2)(L,1,(ci->u).c.ctx);
      }
      luaD_poscall(L,ci,nres);
    }
    unroll(L,ci);
    return;
  }
  ccall(L,pSVar1 + -(long)nres + -1,-1,0);
  return;
}

Assistant:

static void resume (lua_State *L, void *ud) {
  int n = *(cast(int*, ud));  /* number of arguments */
  StkId firstArg = L->top.p - n;  /* first argument */
  CallInfo *ci = L->ci;
  if (L->status == LUA_OK)  /* starting a coroutine? */
    ccall(L, firstArg - 1, LUA_MULTRET, 0);  /* just call its body */
  else {  /* resuming from previous yield */
    lua_assert(L->status == LUA_YIELD);
    L->status = LUA_OK;  /* mark that it is running (again) */
    if (isLua(ci)) {  /* yielded inside a hook? */
      /* undo increment made by 'luaG_traceexec': instruction was not
         executed yet */
      lua_assert(ci->callstatus & CIST_HOOKYIELD);
      ci->u.l.savedpc--;
      L->top.p = firstArg;  /* discard arguments */
      luaV_execute(L, ci);  /* just continue running Lua code */
    }
    else {  /* 'common' yield */
      if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
        lua_unlock(L);
        n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
        lua_lock(L);
        api_checknelems(L, n);
      }
      luaD_poscall(L, ci, n);  /* finish 'luaD_call' */
    }
    unroll(L, NULL);  /* run continuation */
  }
}